

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O0

void __thiscall QtMWidgets::Picker::mousePressEvent(Picker *this,QMouseEvent *event)

{
  MouseButton MVar1;
  PickerPrivate *pPVar2;
  QPoint __addr_len;
  sockaddr *__addr;
  int __fd;
  QMouseEvent *event_local;
  Picker *this_local;
  
  __fd = (int)event;
  MVar1 = QSinglePointEvent::button((QSinglePointEvent *)event);
  if (MVar1 == LeftButton) {
    pPVar2 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
             ::operator->(&this->d);
    pPVar2->mouseWasMoved = false;
    pPVar2 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
             ::operator->(&this->d);
    pPVar2->mouseMoveDelta = 0;
    __addr_len = QMouseEvent::pos(event);
    pPVar2 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
             ::operator->(&this->d);
    pPVar2->mousePos = __addr_len;
    pPVar2 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
             ::operator->(&this->d);
    pPVar2->leftMouseButtonPressed = true;
    QEvent::accept((QEvent *)event,__fd,__addr,(socklen_t *)__addr_len);
  }
  else {
    QEvent::ignore((QEvent *)event);
  }
  return;
}

Assistant:

void
Picker::mousePressEvent( QMouseEvent * event )
{
	if( event->button() == Qt::LeftButton )
	{
		d->mouseWasMoved = false;
		d->mouseMoveDelta = 0;
		d->mousePos = event->pos();
		d->leftMouseButtonPressed = true;

		event->accept();
	}
	else
		event->ignore();
}